

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O0

int secp256k1_ecdsa_verify
              (secp256k1_context *ctx,secp256k1_ecdsa_signature *sig,uchar *msghash32,
              secp256k1_pubkey *pubkey)

{
  int iVar1;
  bool local_e9;
  undefined1 local_e8 [8];
  secp256k1_scalar m;
  secp256k1_scalar s;
  secp256k1_scalar r;
  secp256k1_ge q;
  secp256k1_pubkey *pubkey_local;
  uchar *msghash32_local;
  secp256k1_ecdsa_signature *sig_local;
  secp256k1_context *ctx_local;
  
  if (msghash32 == (uchar *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"msghash32 != NULL");
    ctx_local._4_4_ = 0;
  }
  else if (sig == (secp256k1_ecdsa_signature *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"sig != NULL");
    ctx_local._4_4_ = 0;
  }
  else if (pubkey == (secp256k1_pubkey *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"pubkey != NULL");
    ctx_local._4_4_ = 0;
  }
  else {
    secp256k1_scalar_set_b32((secp256k1_scalar *)local_e8,msghash32,(int *)0x0);
    secp256k1_ecdsa_signature_load
              (ctx,(secp256k1_scalar *)(s.d + 3),(secp256k1_scalar *)(m.d + 3),sig);
    iVar1 = secp256k1_scalar_is_high((secp256k1_scalar *)(m.d + 3));
    local_e9 = false;
    if (iVar1 == 0) {
      iVar1 = secp256k1_pubkey_load(ctx,(secp256k1_ge *)(r.d + 3),pubkey);
      local_e9 = false;
      if (iVar1 != 0) {
        iVar1 = secp256k1_ecdsa_sig_verify
                          ((secp256k1_scalar *)(s.d + 3),(secp256k1_scalar *)(m.d + 3),
                           (secp256k1_ge *)(r.d + 3),(secp256k1_scalar *)local_e8);
        local_e9 = iVar1 != 0;
      }
    }
    ctx_local._4_4_ = (uint)local_e9;
  }
  return ctx_local._4_4_;
}

Assistant:

int secp256k1_ecdsa_verify(const secp256k1_context* ctx, const secp256k1_ecdsa_signature *sig, const unsigned char *msghash32, const secp256k1_pubkey *pubkey) {
    secp256k1_ge q;
    secp256k1_scalar r, s;
    secp256k1_scalar m;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(msghash32 != NULL);
    ARG_CHECK(sig != NULL);
    ARG_CHECK(pubkey != NULL);

    secp256k1_scalar_set_b32(&m, msghash32, NULL);
    secp256k1_ecdsa_signature_load(ctx, &r, &s, sig);
    return (!secp256k1_scalar_is_high(&s) &&
            secp256k1_pubkey_load(ctx, &q, pubkey) &&
            secp256k1_ecdsa_sig_verify(&r, &s, &q, &m));
}